

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void * TableSettingsHandler_ReadOpen(ImGuiContext *param_1,ImGuiSettingsHandler *param_2,char *name)

{
  int iVar1;
  ImGuiTableSettings *pIVar2;
  undefined8 in_RDX;
  int unaff_retaddr;
  ImGuiTableSettings *settings;
  int columns_count;
  ImGuiID id;
  int local_28;
  ImGuiID id_00;
  ImGuiTableSettings *local_8;
  
  id_00 = 0;
  local_28 = 0;
  iVar1 = __isoc99_sscanf(in_RDX,"0x%08X,%d",&stack0xffffffffffffffdc,&local_28);
  if (iVar1 < 2) {
    local_8 = (ImGuiTableSettings *)0x0;
  }
  else {
    pIVar2 = ImGui::TableSettingsFindByID(id_00);
    if (pIVar2 != (ImGuiTableSettings *)0x0) {
      if (local_28 <= pIVar2->ColumnsCountMax) {
        TableSettingsInit(_columns_count,settings._4_4_,(int)settings,unaff_retaddr);
        return pIVar2;
      }
      pIVar2->ID = 0;
    }
    local_8 = ImGui::TableSettingsCreate((ImGuiID)((ulong)in_RDX >> 0x20),(int)in_RDX);
  }
  return local_8;
}

Assistant:

static void* TableSettingsHandler_ReadOpen(ImGuiContext*, ImGuiSettingsHandler*, const char* name)
{
    ImGuiID id = 0;
    int columns_count = 0;
    if (sscanf(name, "0x%08X,%d", &id, &columns_count) < 2)
        return NULL;

    if (ImGuiTableSettings* settings = ImGui::TableSettingsFindByID(id))
    {
        if (settings->ColumnsCountMax >= columns_count)
        {
            TableSettingsInit(settings, id, columns_count, settings->ColumnsCountMax); // Recycle
            return settings;
        }
        settings->ID = 0; // Invalidate storage, we won't fit because of a count change
    }
    return ImGui::TableSettingsCreate(id, columns_count);
}